

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void MovePos(CLzmaEnc *p,UInt32 num)

{
  if (num != 0) {
    p->additionalOffset = p->additionalOffset + num;
    (*(p->matchFinder).Skip)(p->matchFinderObj,num);
    return;
  }
  return;
}

Assistant:

static void MovePos(CLzmaEnc *p, UInt32 num)
{
  #ifdef SHOW_STAT
  g_STAT_OFFSET += num;
  printf("\n MovePos %u", num);
  #endif
  
  if (num != 0)
  {
    p->additionalOffset += num;
    p->matchFinder.Skip(p->matchFinderObj, num);
  }
}